

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O1

int color_char_to_attr(char c)

{
  int iVar1;
  color_type *pcVar2;
  long lVar3;
  
  if (c < '\0') {
    return (int)c;
  }
  if ((c & 0x5fU) == 0) {
    return 0;
  }
  pcVar2 = color_table;
  lVar3 = 0;
  do {
    if (pcVar2->index_char == c) goto LAB_00211703;
    lVar3 = lVar3 + 1;
    pcVar2 = pcVar2 + 1;
  } while (lVar3 != 0x1e);
  lVar3 = 0x1e;
LAB_00211703:
  iVar1 = 1;
  if ((int)lVar3 != 0x1e) {
    iVar1 = (int)lVar3;
  }
  return iVar1;
}

Assistant:

int color_char_to_attr(char c)
{
	int a;

	/* Is negative -- spit it right back out */
	if (c < 0) return (c);

	/* Is a space or '\0' -- return black */
	if (c == '\0' || c == ' ') return (COLOUR_DARK);

	/* Search the color table */
	for (a = 0; a < BASIC_COLORS; a++)
	{
		/* Look for the index */
		if (color_table[a].index_char == c) break;
	}

	/* If we don't find the color, we assume white */
	if (a == BASIC_COLORS) return (COLOUR_WHITE);

	/* Return the color */
	return (a);
}